

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

Symbol token_end_layout_texp(Env *env)

{
  uint32_t uVar1;
  ContextSort CVar2;
  State *pSVar3;
  Context *pCVar4;
  uint uVar5;
  
  if (env->symbols[9] == true) {
    pSVar3 = env->state;
    uVar1 = (pSVar3->contexts).size;
    if ((uVar1 != 0) && (1 < (int)uVar1)) {
      pCVar4 = (pSVar3->contexts).contents;
      if (pCVar4[uVar1 - 1].sort < Braces) {
        uVar5 = uVar1 - 2;
        do {
          CVar2 = pCVar4[uVar5].sort;
          if ((CVar2 & ~DoLayout) == Braces) {
            (pSVar3->contexts).size = uVar1 - 1;
            return END;
          }
        } while ((0 < (int)uVar5) && (uVar5 = uVar5 - 1, CVar2 < TExp));
      }
    }
  }
  return FAIL;
}

Assistant:

static Symbol token_end_layout_texp(Env *env) {
  return (valid(env, END) && layouts_in_texp(env)) ? end_layout(env, "texp") : FAIL;
}